

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String __thiscall Bstrlib::String::operator+(String *this,uchar c)

{
  uchar in_DL;
  uchar *extraout_RDX;
  undefined7 in_register_00000031;
  String SVar1;
  
  String(this,(String *)CONCAT71(in_register_00000031,c));
  operator+=(this,in_DL);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = this;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String String::operator+(unsigned char c) const
    {
        String retval(*this);
        retval += c;
        return retval;
    }